

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::base::UnixSocket::SetTxTimeout(UnixSocket *this,uint32_t timeout_ms)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  char *fname;
  uint *puVar4;
  int *piVar5;
  char *pcVar6;
  uint32_t timeout_ms_local;
  UnixSocket *this_local;
  
  bVar3 = UnixSocketRaw::SetTxTimeout(&this->sock_raw_,timeout_ms);
  if (((bVar3 ^ 0xffU) & 1) == 0) {
    return;
  }
  fname = Basename(
                  "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                  );
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  piVar5 = __errno_location();
  pcVar6 = strerror(*piVar5);
  LogMessage(kLogError,fname,0x105ce,"%s (errno: %d, %s)",
             "PERFETTO_CHECK(sock_raw_.SetTxTimeout(timeout_ms))",(ulong)uVar1,pcVar6);
  MaybeSerializeLastLogsForCrashReporting();
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
}

Assistant:

void SetTxTimeout(uint32_t timeout_ms) {
    PERFETTO_CHECK(sock_raw_.SetTxTimeout(timeout_ms));
  }